

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsMessageQueue::~TadsMessageQueue(TadsMessageQueue *this)

{
  TadsMessageQueue *in_RDI;
  
  ~TadsMessageQueue(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

~TadsMessageQueue()
    {
        /* discard any messages still in the queue */
        flush();

        /* destroy our synchronization resources */
        mu->release_ref();
        ev->release_ref();
        if (quit_evt != 0)
            quit_evt->release_ref();
    }